

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyFreeAnchors(TidyDocImpl *doc)

{
  Anchor *a_00;
  uint local_24;
  uint h;
  Anchor *a;
  TidyAttribImpl *attribs;
  TidyDocImpl *doc_local;
  
  for (local_24 = 0; local_24 < 0x3fd; local_24 = local_24 + 1) {
    while (a_00 = (doc->attribs).anchor_hash[local_24], a_00 != (Anchor *)0x0) {
      (doc->attribs).anchor_hash[local_24] = a_00->next;
      FreeAnchor(doc,a_00);
    }
  }
  return;
}

Assistant:

void TY_(FreeAnchors)( TidyDocImpl* doc )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor* a;
    uint h;
    for (h = 0; h < ANCHOR_HASH_SIZE; h++) {
        while (NULL != (a = attribs->anchor_hash[h]) )
        {
            attribs->anchor_hash[h] = a->next;
            FreeAnchor(doc, a);
        }
    }
}